

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  State *s;
  State *s_00;
  Context *this;
  int value;
  Context *context;
  State *stateB;
  State *stateA;
  
  s = (State *)operator_new(8);
  ConcreteStateA::ConcreteStateA((ConcreteStateA *)s);
  s_00 = (State *)operator_new(8);
  ConcreteStateB::ConcreteStateB((ConcreteStateB *)s_00);
  this = (Context *)operator_new(8);
  Context::Context(this);
  Context::setState(this,s);
  iVar1 = Context::request(this);
  if (iVar1 != 10) {
    __assert_fail("value == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/state_test.cc"
                  ,0xf,"int main()");
  }
  Context::setState(this,s_00);
  iVar1 = Context::request(this);
  if (iVar1 == 100) {
    return 0;
  }
  __assert_fail("value == 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/state_test.cc"
                ,0x13,"int main()");
}

Assistant:

int main() {
  State *stateA = new ConcreteStateA;
  State *stateB = new ConcreteStateB;

  Context *context = new Context;

  context->setState(stateA);
  int value = context->request();
  assert(value == 10);

  context->setState(stateB);
  value = context->request();
  assert(value == 100);
}